

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionProxy::UpdateFunctionBodyImpl(FunctionProxy *this,FunctionBody *body)

{
  Type *addr;
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  pFVar5 = (this->functionInfo).ptr;
  if ((pFVar5->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80b,"(functionInfo->GetFunctionProxy() == this)",
                                "functionInfo->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0075bc3c;
    *puVar4 = 0;
  }
  bVar3 = IsFunctionBody(this);
  if (body != (FunctionBody *)this && bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80c,"(!this->IsFunctionBody() || body == this)",
                                "!this->IsFunctionBody() || body == this");
    if (!bVar3) goto LAB_0075bc3c;
    *puVar4 = 0;
  }
  Memory::Recycler::WBSetBit((char *)&pFVar5->functionBodyImpl);
  (pFVar5->functionBodyImpl).ptr = (FunctionProxy *)body;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pFVar5->functionBodyImpl);
  addr = &(body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr = pFVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  TVar1 = pFVar5->attributes;
  pFVar5 = (body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar5 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54c,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0075bc3c;
    *puVar4 = 0;
    pFVar5 = addr->ptr;
  }
  if ((FunctionBody *)(pFVar5->functionBodyImpl).ptr != body) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_0075bc3c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar5 = addr->ptr;
  }
  pFVar5->attributes = TVar1 & ~(DeferredParse|DeferredDeserialize);
  return;
}

Assistant:

void
    FunctionProxy::UpdateFunctionBodyImpl(FunctionBody * body)
    {
        FunctionInfo *functionInfo = this->GetFunctionInfo();
        Assert(functionInfo->GetFunctionProxy() == this);
        Assert(!this->IsFunctionBody() || body == this);
        functionInfo->SetFunctionProxy(body);
        body->SetFunctionInfo(functionInfo);
        body->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() & ~(FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::DeferredDeserialize)));
    }